

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::ParseableFunctionInfo::SetIsNonUserCode(ParseableFunctionInfo *this,bool set)

{
  NestedArray *pNVar1;
  ParseableFunctionInfo *this_00;
  ulong uVar2;
  
  this->flags = set << 4 |
                this->flags &
                (Flags_HasRestParameter|Flags_HasNoExplicitReturnValue|Flags_HasOnlyThisStatements|
                 Flags_HasThis|Flags_HasTry|Flags_HasOrParentHasArguments|Flags_StackNestedFunc);
  pNVar1 = (this->nestedArray).ptr;
  if ((pNVar1 != (NestedArray *)0x0) && (pNVar1->nestedCount != 0)) {
    uVar2 = 0;
    do {
      this_00 = FunctionProxy::GetParseableFunctionInfo
                          (*(FunctionProxy **)((long)pNVar1[uVar2 + 1] + 8));
      if (this_00 != (ParseableFunctionInfo *)0x0) {
        SetIsNonUserCode(this_00,set);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < pNVar1->nestedCount);
  }
  return;
}

Assistant:

void ParseableFunctionInfo::SetIsNonUserCode(bool set)
    {
        // Mark current function as a non-user code, so that we can distinguish cases where exceptions are
        // caught in non-user code (see ProbeContainer::HasAllowedForException).
        SetFlags(set, Flags_NonUserCode);

        // Propagate setting for all functions in this scope (nested).
        this->ForEachNestedFunc([&](FunctionProxy* proxy, uint32 index)
        {
            ParseableFunctionInfo * pBody = proxy->GetParseableFunctionInfo();
            if (pBody != nullptr)
            {
                pBody->SetIsNonUserCode(set);
            }
            return true;
        });
    }